

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::SwizzleOp::tokenize(SwizzleOp *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  int elemNdx;
  long lVar1;
  Token local_70;
  Token local_60;
  string swizzleStr;
  
  deRandom_getUint32(&state->m_random->m_rnd);
  swizzleStr._M_dataplus._M_p = (pointer)&swizzleStr.field_2;
  swizzleStr._M_string_length = 0;
  swizzleStr.field_2._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 < (this->m_outValueRange).m_type.m_numElements; lVar1 = lVar1 + 1) {
    std::__cxx11::string::append((char *)&swizzleStr);
  }
  (*this->m_child->_vptr_Expression[3])(this->m_child,state,str);
  local_60.m_type = DOT;
  this_00 = TokenStream::operator<<(str,&local_60);
  Token::Token(&local_70,swizzleStr._M_dataplus._M_p);
  TokenStream::operator<<(this_00,&local_70);
  Token::~Token(&local_70);
  Token::~Token(&local_60);
  std::__cxx11::string::~string((string *)&swizzleStr);
  return;
}

Assistant:

void SwizzleOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	const char*		rgbaSet[]	= { "r", "g", "b", "a" };
	const char*		xyzwSet[]	= { "x", "y", "z", "w" };
	const char*		stpqSet[]	= { "s", "t", "p", "q" };
	const char**	swizzleSet	= DE_NULL;

	switch (state.getRandom().getInt(0, 2))
	{
		case 0: swizzleSet = rgbaSet; break;
		case 1: swizzleSet = xyzwSet; break;
		case 2: swizzleSet = stpqSet; break;
		default: DE_ASSERT(DE_FALSE);
	}

	std::string swizzleStr;
	for (int elemNdx = 0; elemNdx < m_outValueRange.getType().getNumElements(); elemNdx++)
		swizzleStr += swizzleSet[m_swizzle[elemNdx]];

	m_child->tokenize(state, str);
	str << Token::DOT << Token(swizzleStr.c_str());
}